

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_readCTable(HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize)

{
  U16 UVar1;
  U32 UVar2;
  char cVar3;
  uint uVar4;
  uint local_1e8;
  uint local_1e4;
  U32 n_4;
  U32 n_3;
  U16 local_1d8;
  U16 min;
  U32 n_2;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 w;
  U32 n_1;
  U32 current;
  U32 nextRankStart;
  U32 n;
  size_t readSize;
  U32 nbSymbols;
  U32 tableLog;
  U32 rankVal [16];
  BYTE huffWeight [256];
  size_t srcSize_local;
  void *src_local;
  uint *maxSymbolValuePtr_local;
  HUF_CElt *CTable_local;
  
  readSize._4_4_ = 0;
  readSize._0_4_ = 0;
  CTable_local = (HUF_CElt *)
                 HUF_readStats((BYTE *)(rankVal + 0xe),0x100,&nbSymbols,(U32 *)&readSize,
                               (U32 *)((long)&readSize + 4),src,srcSize);
  uVar4 = ERR_isError((size_t)CTable_local);
  if (uVar4 == 0) {
    if (readSize._4_4_ < 0xd) {
      if (*maxSymbolValuePtr + 1 < (uint)readSize) {
        CTable_local = (HUF_CElt *)0xffffffffffffffd0;
      }
      else {
        n_1 = 0;
        for (current = 1; current <= readSize._4_4_; current = current + 1) {
          UVar2 = (&nbSymbols)[current];
          cVar3 = (char)current;
          (&nbSymbols)[current] = n_1;
          n_1 = (UVar2 << (cVar3 - 1U & 0x1f)) + n_1;
        }
        nbPerRank[0xc] = 0;
        nbPerRank[0xd] = 0;
        for (; (uint)nbPerRank._24_4_ < (uint)readSize; nbPerRank._24_4_ = nbPerRank._24_4_ + 1) {
          CTable[(uint)nbPerRank._24_4_].nbBits =
               ((char)readSize._4_4_ + '\x01') -
               *(char *)((long)rankVal + (ulong)(uint)nbPerRank._24_4_ + 0x38);
        }
        memset(valPerRank + 0xc,0,0x1c);
        memset(&local_1d8,0,0x1c);
        for (n_3 = 0; n_3 < (uint)readSize; n_3 = n_3 + 1) {
          valPerRank[(ulong)CTable[n_3].nbBits + 0xc] =
               valPerRank[(ulong)CTable[n_3].nbBits + 0xc] + 1;
        }
        (&local_1d8)[readSize._4_4_ + 1] = 0;
        n_4._2_2_ = 0;
        for (local_1e4 = readSize._4_4_; local_1e4 != 0; local_1e4 = local_1e4 - 1) {
          (&local_1d8)[local_1e4] = n_4._2_2_;
          n_4._2_2_ = (U16)((int)(uint)(ushort)(n_4._2_2_ + valPerRank[(ulong)local_1e4 + 0xc]) >> 1
                           );
        }
        for (local_1e8 = 0; local_1e8 < (uint)readSize; local_1e8 = local_1e8 + 1) {
          UVar1 = (&local_1d8)[CTable[local_1e8].nbBits];
          (&local_1d8)[CTable[local_1e8].nbBits] = UVar1 + 1;
          CTable[local_1e8].val = UVar1;
        }
        *maxSymbolValuePtr = (uint)readSize - 1;
      }
    }
    else {
      CTable_local = (HUF_CElt *)0xffffffffffffffd4;
    }
  }
  return (size_t)CTable_local;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 current = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = current;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            CTable[n].nbBits = (BYTE)(tableLog + 1 - w);
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[CTable[n].nbBits]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) CTable[n].val = valPerRank[CTable[n].nbBits]++; }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}